

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

bool Clasp::Cli::ClaspAppBase::parsePositional(string *t,string *out)

{
  int num;
  int local_c;
  
  Potassco::string_cast<int>(t,&local_c);
  std::__cxx11::string::assign((char *)out);
  return true;
}

Assistant:

bool ClaspAppBase::parsePositional(const std::string& t, std::string& out) {
	int num;
	if (Potassco::string_cast(t, num)) { out = "number"; }
	else                               { out = "file";   }
	return true;
}